

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O3

shared_ptr<LToken> __thiscall LLexer::next_token(LLexer *this)

{
  char cVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  string *in_RSI;
  byte bVar4;
  ulong uVar5;
  shared_ptr<LToken> sVar6;
  stringstream ss;
  byte abStack_268 [8];
  element_type *local_260;
  long *plStack_258;
  long alStack_248 [14];
  long *plStack_1d8;
  long alStack_1c8 [2];
  LNodeType local_1b8 [4];
  ostream aoStack_1a8 [112];
  ios_base aiStack_138 [264];
  
  cVar1 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
  if (cVar1 == '\0') {
    local_1b8[0] = EOFF;
    this->_vptr_LLexer = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<LToken,std::allocator<LToken>,LNodeType,char_const(&)[1]>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->prev_char,(LToken **)this,
               (allocator<LToken> *)abStack_268,local_1b8,(char (*) [1])0x119b46);
    _Var3._M_pi = extraout_RDX;
LAB_00112c40:
    sVar6.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
    sVar6.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<LToken>)sVar6.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_260 = (element_type *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
LAB_00112a19:
  uVar2 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
  uVar5 = (ulong)uVar2;
  bVar4 = (byte)uVar2;
  if ((((bVar4 < 0x21) && ((0x100002201U >> (uVar5 & 0x3f) & 1) != 0)) ||
      (0xf5 < (byte)(bVar4 - 0x3a))) || ((bVar4 == 0x5f || (0xe5 < (byte)((bVar4 & 0xdf) + 0xa5)))))
  {
LAB_00112b0a:
    if ((0x20 < bVar4) || ((0x100002201U >> (uVar5 & 0x3f) & 1) == 0)) goto LAB_00112b16;
  }
  else {
    if (0x3e < bVar4) {
LAB_00112abd:
      if ((int)(uVar5 & 0xff) != 0x7e) goto LAB_00112b0a;
      goto LAB_00112cbd;
    }
    if ((uVar5 & 0xff) != 0x2d) {
      if ((0x1b0000000400U >> (uVar5 & 0x3f) & 1) != 0) {
        abStack_268[0] = bVar4;
        std::__ostream_insert<char,std::char_traits<char>>(aoStack_1a8,(char *)abStack_268,1);
        std::__cxx11::stringbuf::str();
        this = (LLexer *)local_260;
        from_symbol((LLexer *)local_260,in_RSI);
        if (plStack_258 != alStack_248) {
          operator_delete(plStack_258,alStack_248[0] + 1);
        }
        (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
        goto LAB_00112c1f;
      }
      if ((0x7000000000000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00112abd;
LAB_00112cbd:
      abStack_268[0] = bVar4;
      std::__ostream_insert<char,std::char_traits<char>>(aoStack_1a8,(char *)abStack_268,1);
      (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
      cVar1 = (**(code **)((in_RSI->_M_dataplus)._M_p + 0x10))();
      if (cVar1 == '=') {
        abStack_268[0] = bVar4;
        std::__ostream_insert<char,std::char_traits<char>>(aoStack_1a8,(char *)abStack_268,1);
        (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
      }
      std::__cxx11::stringbuf::str();
      this = (LLexer *)local_260;
      from_symbol((LLexer *)local_260,in_RSI);
      if (plStack_1d8 != alStack_1c8) {
        operator_delete(plStack_1d8,alStack_1c8[0] + 1);
      }
LAB_00112c1f:
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00112c40;
    }
LAB_00112b16:
    abStack_268[0] = bVar4;
    std::__ostream_insert<char,std::char_traits<char>>(aoStack_1a8,(char *)abStack_268,1);
  }
  (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))();
  goto LAB_00112a19;
}

Assistant:

std::shared_ptr<LToken> LLexer::next_token() {
    if (this->peek() == 0) return std::make_shared<LToken>(LNodeType::EOFF, "");
    int state = 0;
    std::stringstream ss;
    while (true) {
        char c = this->peek();
        switch (state) {
            case 0:
                if (is_blank(c)) {
                    state = 0;
                } else if (is_num(c)) {
                    state = 1;
                } else if (is_word_char(c)) {
                    state = 2;
                } else if (is_minus(c)) {
                    state = 3;
                } else if (is_single_symbol(c)) {
                    ss << c;
                    auto token = this->from_symbol(ss.str());
                    this->move();
                    return token;
                } else if (is_double_symbol(c)) {
                    ss << c;
                    this->move();
                    if (this->peek() == '=') {
                        ss << c;
                        this->move();
                    }
                    return this->from_symbol(ss.str());
                }
                break;
            case 1:
                if (!is_num(c)) {
                    return this->from_int(ss.str());
                }
                break;
            case 2:
                if (!(is_word_char(c) || is_num(c))) {
                    return this->from_string(ss.str());
                }
                break;
            case 3:
                if (is_num(3)) {
                    state = 1;
                } else {
                    return this->from_symbol(ss.str());
                }
                break;
            default:
                return nullptr;
        }
        if (!is_blank(c)) ss << c;
        this->move();
    }
}